

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::ComputeCommand::submitAndWait
          (ComputeCommand *this,deUint32 queueFamilyIndex,VkQueue queue,
          VkDescriptorUpdateTemplateKHR updateTemplate,void *rawUpdateData)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer_s *pVVar2;
  VkDevice pVVar3;
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  RefData<vk::Handle<(vk::HandleType)6>_> data_00;
  RefData<vk::VkCommandBuffer_s_*> data_01;
  bool bVar4;
  VkResult VVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Handle<(vk::HandleType)24> *pHVar9;
  VkCommandBuffer_s **ppVVar10;
  Handle<(vk::HandleType)6> *pHVar11;
  undefined8 uStack_258;
  VkSubmitInfo submitInfo;
  Handle<(vk::HandleType)32> local_1f8;
  deUint64 local_1f0;
  deUint64 local_1e8;
  undefined8 local_1e0;
  deUint64 infiniteTimeout;
  RefData<vk::VkCommandBuffer_s_*> local_1b8;
  undefined1 local_198 [8];
  Unique<vk::VkCommandBuffer_s_*> cmd;
  RefData<vk::Handle<(vk::HandleType)6>_> local_158;
  undefined1 local_138 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> cmdCompleteFence;
  VkCommandBufferBeginInfo cmdBufBeginInfo;
  VkCommandBufferAllocateInfo cmdBufCreateInfo;
  VkFenceCreateInfo fenceCreateInfo;
  Move<vk::Handle<(vk::HandleType)24>_> local_a8;
  RefData<vk::Handle<(vk::HandleType)24>_> local_88;
  undefined1 local_68 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandPoolCreateInfo cmdPoolCreateInfo;
  void *rawUpdateData_local;
  VkQueue queue_local;
  deUint32 queueFamilyIndex_local;
  ComputeCommand *this_local;
  VkDescriptorUpdateTemplateKHR updateTemplate_local;
  
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_ = 0x27;
  this_local = (ComputeCommand *)updateTemplate.m_internal;
  ::vk::createCommandPool
            (&local_a8,this->m_vki,this->m_device,
             (VkCommandPoolCreateInfo *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_88,(Move *)&local_a8);
  data.deleter.m_deviceIface._0_4_ = (int)local_88.deleter.m_deviceIface;
  data.object.m_internal = local_88.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_88.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_88.deleter.m_device;
  data.deleter.m_allocator._0_4_ = (int)local_88.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_88.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_68,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_a8);
  cmdBufCreateInfo.level = 8;
  cmdBufCreateInfo.commandBufferCount = 0;
  cmdBufBeginInfo.pInheritanceInfo._0_4_ = 0x28;
  cmdBufCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufCreateInfo._4_4_ = 0;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_68);
  cmdBufCreateInfo.pNext = (void *)pHVar9->m_internal;
  cmdBufCreateInfo.commandPool.m_internal._0_4_ = 0;
  cmdBufCreateInfo.commandPool.m_internal._4_4_ = 1;
  cmdBufBeginInfo.pNext = (void *)0x1;
  cmdBufBeginInfo.flags = 0;
  cmdBufBeginInfo._20_4_ = 0;
  cmdCompleteFence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x2a;
  cmdBufBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufBeginInfo._4_4_ = 0;
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)
                    &cmd.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,this->m_vki,
                    this->m_device,(VkFenceCreateInfo *)&cmdBufCreateInfo.level,
                    (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_158,(Move *)&cmd.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_158.deleter.m_deviceIface;
  data_00.object.m_internal = local_158.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_158.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_158.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_158.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_158.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_138,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)
             &cmd.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&infiniteTimeout,this->m_vki,this->m_device,
             (VkCommandBufferAllocateInfo *)&cmdBufBeginInfo.pInheritanceInfo);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1b8,(Move *)&infiniteTimeout);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_1b8.deleter.m_deviceIface;
  data_01.object = local_1b8.object;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1b8.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_1b8.deleter.m_device;
  data_01.deleter.m_pool.m_internal._0_4_ = (int)local_1b8.deleter.m_pool.m_internal;
  data_01.deleter.m_pool.m_internal._4_4_ = (int)(local_1b8.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_198,data_01);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
            ((Move<vk::VkCommandBuffer_s_*> *)&infiniteTimeout);
  local_1e0 = 0xffffffffffffffff;
  pDVar1 = this->m_vki;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_198);
  VVar5 = (*pDVar1->_vptr_DeviceInterface[0x49])
                    (pDVar1,*ppVVar10,
                     &cmdCompleteFence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                      m_allocator);
  ::vk::checkResult(VVar5,"m_vki.beginCommandBuffer(*cmd, &cmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x831);
  pDVar1 = this->m_vki;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_198);
  local_1e8 = (this->m_pipeline).m_internal;
  (*pDVar1->_vptr_DeviceInterface[0x4c])(pDVar1,*ppVVar10,1,local_1e8);
  if (this->m_numDescriptorSets != 0) {
    pDVar1 = this->m_vki;
    ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_198);
    local_1f0 = (this->m_pipelineLayout).m_internal;
    (*pDVar1->_vptr_DeviceInterface[0x56])
              (pDVar1,*ppVVar10,1,local_1f0,0,(ulong)(uint)this->m_numDescriptorSets,
               this->m_descriptorSets,this->m_numDynamicOffsets,this->m_dynamicOffsets);
  }
  ::vk::Handle<(vk::HandleType)32>::Handle(&local_1f8,0);
  bVar4 = ::vk::Handle<(vk::HandleType)32>::operator!=
                    ((Handle<(vk::HandleType)32> *)&this_local,&local_1f8);
  if (bVar4) {
    pDVar1 = this->m_vki;
    ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_198);
    (*pDVar1->_vptr_DeviceInterface[0x93])
              (pDVar1,*ppVVar10,this_local,(this->m_pipelineLayout).m_internal,0,rawUpdateData);
  }
  if (this->m_numPreBarriers != 0) {
    pDVar1 = this->m_vki;
    ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_198);
    (*pDVar1->_vptr_DeviceInterface[0x6d])
              (pDVar1,*ppVVar10,1,0x800,0,0,0,this->m_numPreBarriers,this->m_preBarriers,0,0);
  }
  pDVar1 = this->m_vki;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_198);
  pVVar2 = *ppVVar10;
  uVar6 = tcu::Vector<unsigned_int,_3>::x(&this->m_numWorkGroups);
  uVar7 = tcu::Vector<unsigned_int,_3>::y(&this->m_numWorkGroups);
  uVar8 = tcu::Vector<unsigned_int,_3>::z(&this->m_numWorkGroups);
  (*pDVar1->_vptr_DeviceInterface[0x5d])(pDVar1,pVVar2,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8);
  pDVar1 = this->m_vki;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_198);
  (*pDVar1->_vptr_DeviceInterface[0x6d])
            (pDVar1,*ppVVar10,0x800,1,0,0,0,this->m_numPostBarriers,this->m_postBarriers,0,0);
  pDVar1 = this->m_vki;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_198);
  VVar5 = (*pDVar1->_vptr_DeviceInterface[0x4a])(pDVar1,*ppVVar10);
  ::vk::checkResult(VVar5,"m_vki.endCommandBuffer(*cmd)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x84b);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_258 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_198);
  pDVar1 = this->m_vki;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_138);
  VVar5 = (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,queue,1,&uStack_258,pHVar11->m_internal);
  ::vk::checkResult(VVar5,"m_vki.queueSubmit(queue, 1, &submitInfo, *cmdCompleteFence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x85b);
  pDVar1 = this->m_vki;
  pVVar3 = this->m_device;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_138);
  VVar5 = (*pDVar1->_vptr_DeviceInterface[0x16])(pDVar1,pVVar3,1,pHVar11,0,0xffffffffffffffff);
  ::vk::checkResult(VVar5,
                    "m_vki.waitForFences(m_device, 1, &cmdCompleteFence.get(), 0u, infiniteTimeout)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x85d);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_198);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_138);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_68);
  return;
}

Assistant:

void ComputeCommand::submitAndWait (deUint32 queueFamilyIndex, vk::VkQueue queue, vk::VkDescriptorUpdateTemplateKHR updateTemplate, const void *rawUpdateData) const
{
	const vk::VkCommandPoolCreateInfo				cmdPoolCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,
		DE_NULL,
		vk::VK_COMMAND_POOL_CREATE_TRANSIENT_BIT,			// flags
		queueFamilyIndex,									// queueFamilyIndex
	};
	const vk::Unique<vk::VkCommandPool>				cmdPool				(vk::createCommandPool(m_vki, m_device, &cmdPoolCreateInfo));

	const vk::VkFenceCreateInfo						fenceCreateInfo		=
	{
		vk::VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,
		DE_NULL,
		0u,			// flags
	};

	const vk::VkCommandBufferAllocateInfo			cmdBufCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,
		DE_NULL,
		*cmdPool,											// cmdPool
		vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY,				// level
		1u,													// count
	};
	const vk::VkCommandBufferBeginInfo				cmdBufBeginInfo		=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		vk::VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// flags
		(const vk::VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	const vk::Unique<vk::VkFence>					cmdCompleteFence	(vk::createFence(m_vki, m_device, &fenceCreateInfo));
	const vk::Unique<vk::VkCommandBuffer>			cmd					(vk::allocateCommandBuffer(m_vki, m_device, &cmdBufCreateInfo));
	const deUint64									infiniteTimeout		= ~(deUint64)0u;

	VK_CHECK(m_vki.beginCommandBuffer(*cmd, &cmdBufBeginInfo));

	m_vki.cmdBindPipeline(*cmd, vk::VK_PIPELINE_BIND_POINT_COMPUTE, m_pipeline);

	if (m_numDescriptorSets)
	{
		m_vki.cmdBindDescriptorSets(*cmd, vk::VK_PIPELINE_BIND_POINT_COMPUTE, m_pipelineLayout, 0, m_numDescriptorSets, m_descriptorSets, m_numDynamicOffsets, m_dynamicOffsets);
	}

	if (updateTemplate != DE_NULL)
	{
		// we need to update the push descriptors
		m_vki.cmdPushDescriptorSetWithTemplateKHR(*cmd, updateTemplate, m_pipelineLayout, 0, rawUpdateData);
	}

	if (m_numPreBarriers)
		m_vki.cmdPipelineBarrier(*cmd, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, vk::VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (vk::VkDependencyFlags)0,
								 0, (const vk::VkMemoryBarrier*)DE_NULL,
								 m_numPreBarriers, m_preBarriers,
								 0, (const vk::VkImageMemoryBarrier*)DE_NULL);

	m_vki.cmdDispatch(*cmd, m_numWorkGroups.x(), m_numWorkGroups.y(), m_numWorkGroups.z());
	m_vki.cmdPipelineBarrier(*cmd, vk::VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (vk::VkDependencyFlags)0,
							 0, (const vk::VkMemoryBarrier*)DE_NULL,
							 m_numPostBarriers, m_postBarriers,
							 0, (const vk::VkImageMemoryBarrier*)DE_NULL);
	VK_CHECK(m_vki.endCommandBuffer(*cmd));

	// run
	{
		const vk::VkSubmitInfo	submitInfo	=
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
			DE_NULL,
			0u,
			(const vk::VkSemaphore*)0,
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1u,
			&cmd.get(),
			0u,
			(const vk::VkSemaphore*)0,
		};
		VK_CHECK(m_vki.queueSubmit(queue, 1, &submitInfo, *cmdCompleteFence));
	}
	VK_CHECK(m_vki.waitForFences(m_device, 1, &cmdCompleteFence.get(), 0u, infiniteTimeout)); // \note: timeout is failure
}